

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  LogMessage *other;
  byte *pbVar4;
  size_t offset;
  long lVar5;
  ulong uVar6;
  long lVar7;
  pair<unsigned_long,_bool> pVar8;
  LogFinisher local_59;
  LogMessage local_58;
  
  pbVar1 = this->buffer_;
  pbVar4 = this->buffer_end_;
  if (((int)pbVar4 - (int)pbVar1 < 10) && ((pbVar4 <= pbVar1 || ((char)pbVar4[-1] < '\0')))) {
    pVar8 = ReadVarint64Fallback(this);
    uVar3 = 0xffffffff;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar3 = -(uint)(pVar8.first >> 0x1f != 0) | (uint)pVar8.first;
    }
  }
  else {
    if (-1 < (char)*pbVar1) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1a1);
      other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (buffer[0]) >= (128): ");
      internal::LogFinisher::operator=(&local_59,other);
      internal::LogMessage::~LogMessage(&local_58);
    }
    if ((long)(char)pbVar1[1] < 0) {
      if ((long)(char)pbVar1[2] < 0) {
        if ((long)(char)pbVar1[3] < 0) {
          if ((long)(char)pbVar1[4] < 0) {
            if ((long)(char)pbVar1[5] < 0) {
              if ((long)(char)pbVar1[6] < 0) {
                if ((long)(char)pbVar1[7] < 0) {
                  if ((long)(char)pbVar1[8] < 0) {
                    uVar6 = (ulong)(char)pbVar1[9];
                    if ((long)uVar6 < 0) {
                      bVar2 = false;
                      lVar7 = 0xb;
                    }
                    else {
                      uVar6 = uVar6 << 0x3f;
                      lVar5 = 0;
                      lVar7 = 10;
                      pbVar4 = pbVar1;
                      do {
                        uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                        lVar5 = lVar5 + 7;
                        pbVar4 = pbVar4 + 1;
                        bVar2 = true;
                      } while (lVar5 != 0x3f);
                    }
                  }
                  else {
                    uVar6 = (long)(char)pbVar1[8] << 0x38;
                    lVar5 = 0;
                    lVar7 = 9;
                    pbVar4 = pbVar1;
                    do {
                      uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                      lVar5 = lVar5 + 7;
                      pbVar4 = pbVar4 + 1;
                      bVar2 = true;
                    } while (lVar5 != 0x38);
                  }
                }
                else {
                  uVar6 = (long)(char)pbVar1[7] << 0x31;
                  lVar5 = 0;
                  lVar7 = 8;
                  pbVar4 = pbVar1;
                  do {
                    uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                    lVar5 = lVar5 + 7;
                    pbVar4 = pbVar4 + 1;
                    bVar2 = true;
                  } while (lVar5 != 0x31);
                }
              }
              else {
                uVar6 = (long)(char)pbVar1[6] << 0x2a;
                lVar5 = 0;
                lVar7 = 7;
                pbVar4 = pbVar1;
                do {
                  uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                  lVar5 = lVar5 + 7;
                  pbVar4 = pbVar4 + 1;
                  bVar2 = true;
                } while (lVar5 != 0x2a);
              }
            }
            else {
              uVar6 = (long)(char)pbVar1[5] << 0x23;
              lVar5 = 0;
              lVar7 = 6;
              pbVar4 = pbVar1;
              do {
                uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                lVar5 = lVar5 + 7;
                pbVar4 = pbVar4 + 1;
                bVar2 = true;
              } while (lVar5 != 0x23);
            }
          }
          else {
            uVar6 = (long)(char)pbVar1[4] << 0x1c;
            lVar7 = 0;
            pbVar4 = pbVar1;
            do {
              uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar7 & 0x3f));
              lVar7 = lVar7 + 7;
              pbVar4 = pbVar4 + 1;
            } while (lVar7 != 0x1c);
            bVar2 = true;
            lVar7 = 5;
          }
        }
        else {
          uVar6 = (long)(char)pbVar1[3] << 0x15;
          lVar7 = 0;
          pbVar4 = pbVar1;
          do {
            uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar7 & 0x3f));
            lVar7 = lVar7 + 7;
            pbVar4 = pbVar4 + 1;
          } while (lVar7 != 0x15);
          bVar2 = true;
          lVar7 = 4;
        }
      }
      else {
        uVar6 = (long)(char)pbVar1[2] << 0xe;
        lVar7 = 0;
        pbVar4 = pbVar1;
        do {
          uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar7 & 0x3f));
          lVar7 = lVar7 + 7;
          pbVar4 = pbVar4 + 1;
        } while (lVar7 == 7);
        bVar2 = true;
        lVar7 = 3;
      }
    }
    else {
      uVar6 = ((long)(char)pbVar1[1] * 0x80 + (ulong)*pbVar1) - 0x80;
      bVar2 = true;
      lVar7 = 2;
    }
    uVar3 = 0xffffffff;
    if ((bVar2) && (uVar6 < 0x80000000)) {
      this->buffer_ = pbVar1 + lVar7;
      uVar3 = (uint)uVar6;
    }
  }
  return uVar3;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64_t>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}